

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall wasm::RemoveNonJSOpsPass::rewriteCopysign(RemoveNonJSOpsPass *this,Binary *curr)

{
  BinaryOp op;
  BinaryOp BVar1;
  BinaryOp op_00;
  pointer this_00;
  pointer this_01;
  pointer pBVar2;
  pointer pBVar3;
  Unary *pUVar4;
  Const *pCVar5;
  Binary *pBVar6;
  Binary *right;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *this_02;
  Literal local_100;
  Literal local_e8;
  undefined4 local_cc;
  Literal local_c8;
  Literal local_b0;
  Literal local_98;
  Literal local_80;
  BinaryOp local_64;
  BinaryOp local_60;
  BinaryOp bitOr;
  BinaryOp bitAnd;
  UnaryOp float2int;
  UnaryOp int2float;
  undefined1 local_48 [8];
  Literal otherBits;
  Literal signBit;
  Binary *curr_local;
  RemoveNonJSOpsPass *this_local;
  
  wasm::Literal::Literal((Literal *)&otherBits.type);
  wasm::Literal::Literal((Literal *)local_48);
  if (curr->op == CopySignFloat32) {
    bitOr = OrInt64;
    bitAnd = LeUInt64;
    local_60 = AndInt32;
    local_64 = OrInt32;
    wasm::Literal::Literal(&local_80,0x80000000);
    wasm::Literal::operator=((Literal *)&otherBits.type,&local_80);
    wasm::Literal::~Literal(&local_80);
    wasm::Literal::Literal(&local_98,0x7fffffff);
    wasm::Literal::operator=((Literal *)local_48,&local_98);
    wasm::Literal::~Literal(&local_98);
  }
  else {
    if (curr->op != CopySignFloat64) {
      local_cc = 1;
      goto LAB_020e493e;
    }
    bitOr = XorInt64;
    bitAnd = GtSInt64;
    local_60 = AndInt64;
    local_64 = OrInt64;
    wasm::Literal::Literal(&local_b0,0x8000000000000000);
    wasm::Literal::operator=((Literal *)&otherBits.type,&local_b0);
    wasm::Literal::~Literal(&local_b0);
    wasm::Literal::Literal(&local_c8,0x7fffffffffffffff);
    wasm::Literal::operator=((Literal *)local_48,&local_c8);
    wasm::Literal::~Literal(&local_c8);
  }
  this_02 = &this->builder;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_02)
  ;
  op_00 = bitAnd;
  this_01 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_02)
  ;
  op = local_64;
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_02);
  BVar1 = local_60;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_02);
  pUVar4 = Builder::makeUnary(pBVar3,bitOr,curr->left);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  wasm::Literal::Literal(&local_e8,(Literal *)local_48);
  pCVar5 = Builder::makeConst(pBVar3,&local_e8);
  pBVar6 = Builder::makeBinary(pBVar2,BVar1,(Expression *)pUVar4,(Expression *)pCVar5);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  BVar1 = local_60;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  pUVar4 = Builder::makeUnary(pBVar3,bitOr,curr->right);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  wasm::Literal::Literal(&local_100,(Literal *)&otherBits.type);
  pCVar5 = Builder::makeConst(pBVar3,&local_100);
  right = Builder::makeBinary(pBVar2,BVar1,(Expression *)pUVar4,(Expression *)pCVar5);
  pBVar6 = Builder::makeBinary(this_01,op,(Expression *)pBVar6,(Expression *)right);
  pUVar4 = Builder::makeUnary(this_00,op_00,(Expression *)pBVar6);
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,(Expression *)pUVar4);
  wasm::Literal::~Literal(&local_100);
  wasm::Literal::~Literal(&local_e8);
  local_cc = 0;
LAB_020e493e:
  wasm::Literal::~Literal((Literal *)local_48);
  wasm::Literal::~Literal((Literal *)&otherBits.type);
  return;
}

Assistant:

void rewriteCopysign(Binary* curr) {

    // i32.copysign(x, y)   =>   f32.reinterpret(
    //   (i32.reinterpret(x) & ~(1 << 31)) |
    //   (i32.reinterpret(y) &  (1 << 31)
    // )
    //
    // i64.copysign(x, y)   =>   f64.reinterpret(
    //   (i64.reinterpret(x) & ~(1 << 63)) |
    //   (i64.reinterpret(y) &  (1 << 63)
    // )

    Literal signBit, otherBits;
    UnaryOp int2float, float2int;
    BinaryOp bitAnd, bitOr;

    switch (curr->op) {
      case CopySignFloat32:
        float2int = ReinterpretFloat32;
        int2float = ReinterpretInt32;
        bitAnd = AndInt32;
        bitOr = OrInt32;
        signBit = Literal(uint32_t(1U << 31));
        otherBits = Literal(~uint32_t(1U << 31));
        break;

      case CopySignFloat64:
        float2int = ReinterpretFloat64;
        int2float = ReinterpretInt64;
        bitAnd = AndInt64;
        bitOr = OrInt64;
        signBit = Literal(uint64_t(1ULL << 63));
        otherBits = Literal(~uint64_t(1ULL << 63));
        break;

      default:
        return;
    }

    replaceCurrent(builder->makeUnary(
      int2float,
      builder->makeBinary(
        bitOr,
        builder->makeBinary(bitAnd,
                            builder->makeUnary(float2int, curr->left),
                            builder->makeConst(otherBits)),
        builder->makeBinary(bitAnd,
                            builder->makeUnary(float2int, curr->right),
                            builder->makeConst(signBit)))));
  }